

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::StddevState,double,duckdb::StandardErrorOfTheMeanOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  long lVar2;
  ulong uVar3;
  FunctionData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar11 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar9 = 0;
      do {
        if (lVar2 == 0) {
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
LAB_003f7909:
          lVar14 = uVar6 - uVar9;
          uVar7 = uVar9;
          if (uVar9 <= uVar6 && lVar14 != 0) {
            dVar16 = *(double *)(state + 8);
            dVar17 = *(double *)(state + 0x10);
            lVar13 = *(long *)state;
            do {
              lVar13 = lVar13 + 1;
              dVar18 = *(double *)(lVar11 + uVar9 * 8);
              dVar21 = dVar18 - dVar16;
              auVar15._8_4_ = (int)((ulong)lVar13 >> 0x20);
              auVar15._0_8_ = lVar13;
              auVar15._12_4_ = 0x45300000;
              dVar16 = dVar21 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) +
                       dVar16;
              dVar17 = dVar17 + (dVar18 - dVar16) * dVar21;
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
            *(long *)state = lVar14 + *(long *)state;
            *(double *)(state + 8) = dVar16;
            *(double *)(state + 0x10) = dVar17;
            uVar7 = uVar6;
          }
        }
        else {
          uVar3 = *(ulong *)(lVar2 + uVar5 * 8);
          uVar6 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar6 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_003f7909;
          uVar7 = uVar6;
          if ((uVar3 != 0) && (uVar7 = uVar9, uVar9 < uVar6)) {
            uVar12 = 0;
            do {
              if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
                lVar14 = *(long *)state + 1;
                *(long *)state = lVar14;
                dVar16 = *(double *)(lVar11 + uVar9 * 8 + uVar12 * 8);
                dVar17 = dVar16 - *(double *)(state + 8);
                auVar19._8_4_ = (int)((ulong)lVar14 >> 0x20);
                auVar19._0_8_ = lVar14;
                auVar19._12_4_ = 0x45300000;
                dVar18 = dVar17 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) +
                         *(double *)(state + 8);
                *(double *)(state + 8) = dVar18;
                *(double *)(state + 0x10) = (dVar16 - dVar18) * dVar17 + *(double *)(state + 0x10);
              }
              uVar12 = uVar12 + 1;
              uVar7 = uVar6;
            } while (uVar6 - uVar9 != uVar12);
          }
        }
        uVar5 = uVar5 + 1;
        uVar9 = uVar7;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_68.input_mask = (ValidityMask *)(input + 0x28);
      local_68.input_idx = 0;
      local_68.input = aggr_input_data;
      STDDevBaseOperation::
      ConstantOperation<double,duckdb::StddevState,duckdb::StandardErrorOfTheMeanOperation>
                ((StddevState *)state,*(double **)(input + 0x20),&local_68,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_68.input_idx == 0) {
      if (count != 0) {
        pFVar4 = ((local_68.input)->bind_data).ptr;
        dVar16 = *(double *)(state + 8);
        dVar17 = *(double *)(state + 0x10);
        iVar8 = 0;
        do {
          iVar10 = iVar8;
          if (pFVar4 != (FunctionData *)0x0) {
            iVar10 = (idx_t)*(uint *)(pFVar4 + iVar8 * 4);
          }
          lVar11 = *(long *)state + 1 + iVar8;
          puVar1 = (&((local_68.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[iVar10];
          dVar18 = (double)puVar1 - dVar16;
          auVar22._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = 0x45300000;
          dVar16 = dVar16 + dVar18 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)
                                     );
          dVar17 = dVar17 + ((double)puVar1 - dVar16) * dVar18;
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar16;
        *(double *)(state + 0x10) = dVar17;
      }
    }
    else if (count != 0) {
      pFVar4 = ((local_68.input)->bind_data).ptr;
      iVar8 = 0;
      do {
        iVar10 = iVar8;
        if (pFVar4 != (FunctionData *)0x0) {
          iVar10 = (idx_t)*(uint *)(pFVar4 + iVar8 * 4);
        }
        if ((*(ulong *)(local_68.input_idx + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
          lVar11 = *(long *)state + 1;
          *(long *)state = lVar11;
          puVar1 = (&((local_68.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[iVar10];
          dVar16 = (double)puVar1 - *(double *)(state + 8);
          auVar20._8_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar20._0_8_ = lVar11;
          auVar20._12_4_ = 0x45300000;
          dVar17 = dVar16 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) +
                   *(double *)(state + 8);
          *(double *)(state + 8) = dVar17;
          *(double *)(state + 0x10) = ((double)puVar1 - dVar17) * dVar16 + *(double *)(state + 0x10)
          ;
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}